

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

int sync_tcp_connect(sync_device *d,char *host,unsigned_short port)

{
  sync_track **ppsVar1;
  int iVar2;
  int iVar3;
  hostent *phVar4;
  undefined8 in_RCX;
  char **ppcVar5;
  long lVar6;
  sockaddr_in sin;
  undefined1 local_b8 [136];
  
  if (d->sock != -1) {
    close(d->sock);
  }
  phVar4 = gethostbyname(host);
  if (phVar4 != (hostent *)0x0) {
    for (ppcVar5 = phVar4->h_addr_list; *ppcVar5 != (char *)0x0; ppcVar5 = ppcVar5 + 1) {
      iVar2 = phVar4->h_addrtype;
      sin.sin_family = (sa_family_t)iVar2;
      sin.sin_port = port << 8 | port >> 8;
      memcpy(&sin.sin_addr,*ppcVar5,(long)phVar4->h_length);
      sin.sin_zero[0] = '\0';
      sin.sin_zero[1] = '\0';
      sin.sin_zero[2] = '\0';
      sin.sin_zero[3] = '\0';
      sin.sin_zero[4] = '\0';
      sin.sin_zero[5] = '\0';
      sin.sin_zero[6] = '\0';
      sin.sin_zero[7] = '\0';
      iVar2 = socket(iVar2,1,0);
      if (iVar2 != -1) {
        iVar3 = connect(iVar2,(sockaddr *)&sin,0x10);
        if ((((-1 < iVar3) &&
             (iVar3 = xsend(iVar2,"hello, synctracker!",0x13,(int)in_RCX), iVar3 == 0)) &&
            (iVar3 = xrecv(iVar2,local_b8,0xc,(int)in_RCX), iVar3 == 0)) &&
           (iVar3 = bcmp("hello, demo!",local_b8,0xc), iVar3 == 0)) {
          d->sock = iVar2;
          for (lVar6 = 0; lVar6 < (int)d->num_tracks; lVar6 = lVar6 + 1) {
            free(d->tracks[lVar6]->keys);
            ppsVar1 = d->tracks;
            ppsVar1[lVar6]->keys = (track_key *)0x0;
            ppsVar1[lVar6]->num_keys = 0;
          }
          lVar6 = 0;
          do {
            if ((int)d->num_tracks <= lVar6) {
              return 0;
            }
            iVar2 = fetch_track_data(d,d->tracks[lVar6]);
            lVar6 = lVar6 + 1;
          } while (iVar2 == 0);
          close(d->sock);
          break;
        }
        close(iVar2);
      }
    }
  }
  d->sock = -1;
  return -1;
}

Assistant:

int sync_tcp_connect(struct sync_device *d, const char *host, unsigned short port)
{
	int i;
	if (d->sock != INVALID_SOCKET)
		closesocket(d->sock);

	d->sock = server_connect(host, port);
	if (d->sock == INVALID_SOCKET)
		return -1;

	for (i = 0; i < (int)d->num_tracks; ++i) {
		free(d->tracks[i]->keys);
		d->tracks[i]->keys = NULL;
		d->tracks[i]->num_keys = 0;
	}

	for (i = 0; i < (int)d->num_tracks; ++i) {
		if (fetch_track_data(d, d->tracks[i])) {
			closesocket(d->sock);
			d->sock = INVALID_SOCKET;
			return -1;
		}
	}
	return 0;
}